

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::ProcessPresetEnvironment(cmake *this)

{
  _Base_ptr p_Var1;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  for (p_Var1 = (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if ((char)p_Var1[3]._M_color == _S_black) {
      local_80.View_._M_str = *(char **)(p_Var1 + 1);
      local_80.View_._M_len = (size_t)p_Var1[1]._M_parent;
      local_b0.View_._M_len = 1;
      local_b0.Digits_[0] = '=';
      local_b0.View_._M_str = local_b0.Digits_;
      cmStrCat<std::__cxx11::string>
                (&local_50,&local_80,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 2));
      cmsys::SystemTools::PutEnv(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void cmake::ProcessPresetEnvironment()
{
  for (auto const& var : this->UnprocessedPresetEnvironment) {
    if (var.second) {
      cmSystemTools::PutEnv(cmStrCat(var.first, '=', *var.second));
    }
  }
}